

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,char *begin_varname,char *end_varname,string *file_name)

{
  vector<int,_std::allocator<int>_> empty_path;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  if (this->annotation_collector_ != (AnnotationCollector *)0x0) {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Annotate(this,begin_varname,end_varname,file_name,(vector<int,_std::allocator<int>_> *)&local_28
            );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const string& file_name) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer.
      return;
    }
    std::vector<int> empty_path;
    Annotate(begin_varname, end_varname, file_name, empty_path);
  }